

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::RandomSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,RandomSampler *this,int n,Allocator alloc)

{
  uint64_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  undefined8 *puVar5;
  allocator_type local_29;
  undefined8 *puVar3;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n == 0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)n * 0x18,8);
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  }
  if (0 < n) {
    uVar4 = 0;
    puVar5 = puVar3;
    do {
      puVar3[2] = (this->rng).inc;
      uVar1 = (this->rng).state;
      *puVar3 = *(undefined8 *)this;
      puVar3[1] = uVar1;
      (__return_storage_ptr__->
      super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar4].
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (ulong)puVar5 | 0x1000000000000;
      uVar4 = uVar4 + 1;
      puVar5 = puVar5 + 3;
      puVar3 = puVar3 + 3;
    } while ((uint)n != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> RandomSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    RandomSampler *samplerMem = (RandomSampler *)alloc.allocate_object<RandomSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}